

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O1

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/date_object.cpp:485:47)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_date_object_cpp:485:47)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  long lVar1;
  double dVar2;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  dVar2 = floor(((double)lVar1 / 1000000000.0) * 1000.0);
  __return_storage_ptr__->type_ = number;
  (__return_storage_ptr__->field_1).n_ = dVar2;
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }